

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.h
# Opt level: O0

void __thiscall
snestistics::EmulateRegisters::write_word
          (EmulateRegisters *this,uint32_t address,uint16_t v,MemoryAccessType reason)

{
  bool bVar1;
  char cVar2;
  uint32_t r_00;
  uint8_t v_00;
  uint8_t bank;
  bool sw;
  uint32_t r;
  MemoryAccessType reason_local;
  uint16_t v_local;
  uint32_t address_local;
  EmulateRegisters *this_local;
  
  r_00 = remap(this,address);
  bVar1 = false;
  v_00 = (uint8_t)(v >> 8);
  if ((r_00 < 0x2100) || (0x21ff < r_00)) {
    if ((0x41ff < r_00) && (r_00 < 0x4500)) {
      special_write_b(this,r_00,(uint8_t)v);
      special_write_b(this,r_00 + 1,v_00);
      bVar1 = true;
    }
  }
  else {
    special_write_a(this,r_00,(uint8_t)v);
    special_write_a(this,r_00 + 1 & 0xffff,v_00);
    bVar1 = true;
  }
  if (this->_write_function != (memoryAccessFunc)0x0) {
    (*this->_write_function)(this->_callback_context,address,r_00,(uint32_t)v,2,reason);
  }
  cVar2 = (char)(r_00 >> 0x10);
  if (((cVar2 == '~') || (cVar2 == '\x7f')) || (bVar1)) {
    *(uint16_t *)(this->_memory + r_00) = v;
  }
  return;
}

Assistant:

inline void write_word(uint32_t address, uint16_t v, MemoryAccessType reason) {
		uint32_t r = remap(address);

		bool sw = false;

		if (r >= 0x002100 && r <= 0x0021FF) {
			special_write_a(r, v&0xFF);
			special_write_a((r+1)&0xFFFF, v>>8);
			sw = true;
		} else if (r >= 0x004200 && r <= 0x0044ff) {
			special_write_b(r, v&0xFF);
			special_write_b((r+1), (v>>8)&0xFF);
			sw = true;
		}

		if(_write_function)
			(*_write_function)(_callback_context, address, r, v, 2, reason);

		// Don't allow writing to memory mapped registers, SRAM etc...
		// NOTE: Remap remaps to 7E when needed
		uint8_t bank = r>>16;
		if (bank != 0x7E && bank != 0x7F && !sw)
			return;

		*((uint16_t*)&(_memory[r])) = v;
	}